

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptual_linear_predictive_coefficients_analysis.cc
# Opt level: O2

void __thiscall
sptk::PerceptualLinearPredictiveCoefficientsAnalysis::PerceptualLinearPredictiveCoefficientsAnalysis
          (PerceptualLinearPredictiveCoefficientsAnalysis *this,int fft_length,int num_channel,
          int num_order,int liftering_coefficient,double compression_factor,double sampling_rate,
          double lowest_frequency,double highest_frequency,double floor)

{
  pointer pdVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> center_frequencies;
  
  this->_vptr_PerceptualLinearPredictiveCoefficientsAnalysis =
       (_func_int **)&PTR__PerceptualLinearPredictiveCoefficientsAnalysis_00118630;
  this->liftering_coefficient_ = liftering_coefficient;
  this->compression_factor_ = compression_factor;
  MelFilterBankAnalysis::MelFilterBankAnalysis
            (&this->mel_filter_bank_analysis_,fft_length,num_channel,sampling_rate,lowest_frequency,
             highest_frequency,floor,true);
  InverseFourierTransform::InverseFourierTransform
            (&this->inverse_fourier_transform_,
             (this->mel_filter_bank_analysis_).num_channel_ * 2 + 2);
  LevinsonDurbinRecursion::LevinsonDurbinRecursion(&this->levinson_durbin_recursion_,num_order);
  LinearPredictiveCoefficientsToCepstrum::LinearPredictiveCoefficientsToCepstrum
            (&this->linear_predictive_coefficients_to_cepstrum_,num_order,num_order);
  this->is_valid_ = true;
  (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((((num_order < num_channel) && (0 < this->liftering_coefficient_)) &&
      (0.0 < this->compression_factor_)) && ((this->mel_filter_bank_analysis_).is_valid_ == true)) {
    iVar3 = (*((this->inverse_fourier_transform_).inverse_fourier_transform_)->
              _vptr_FourierTransformInterface[3])();
    if ((((char)iVar3 != '\0') && ((this->levinson_durbin_recursion_).is_valid_ == true)) &&
       ((this->linear_predictive_coefficients_to_cepstrum_).is_valid_ != false)) {
      center_frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      center_frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      center_frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = MelFilterBankAnalysis::GetCenterFrequencies
                        (&this->mel_filter_bank_analysis_,&center_frequencies);
      if (bVar2) {
        std::vector<double,_std::allocator<double>_>::resize
                  (&this->equal_loudness_curve_,(long)num_channel);
        pdVar1 = (this->equal_loudness_curve_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar4 = 0;
        uVar5 = (ulong)(uint)num_channel;
        if (num_channel < 1) {
          uVar5 = uVar4;
        }
        for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          dVar6 = center_frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4] *
                  center_frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
          dVar7 = dVar6 / (dVar6 + 160000.0);
          pdVar1[uVar4] = ((dVar6 + 1440000.0) * dVar7 * dVar7) / (dVar6 + 9610000.0);
        }
        std::vector<double,_std::allocator<double>_>::resize
                  (&this->cepstal_weights_,(long)num_order);
        uVar5 = (ulong)(uint)num_order;
        if (num_order < 1) {
          uVar5 = 0;
        }
        pdVar1 = (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar4 = 0;
        while (uVar5 != uVar4) {
          iVar3 = this->liftering_coefficient_;
          dVar6 = sin(((double)(int)(uVar4 + 1) * 3.141592653589793) / (double)iVar3);
          pdVar1[uVar4] = dVar6 * (double)iVar3 * 0.5 + 1.0;
          uVar4 = uVar4 + 1;
        }
      }
      else {
        this->is_valid_ = false;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&center_frequencies.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

PerceptualLinearPredictiveCoefficientsAnalysis::
    PerceptualLinearPredictiveCoefficientsAnalysis(
        int fft_length, int num_channel, int num_order,
        int liftering_coefficient, double compression_factor,
        double sampling_rate, double lowest_frequency, double highest_frequency,
        double floor)
    : liftering_coefficient_(liftering_coefficient),
      compression_factor_(compression_factor),
      mel_filter_bank_analysis_(fft_length, num_channel, sampling_rate,
                                lowest_frequency, highest_frequency, floor,
                                true),
      inverse_fourier_transform_(2 * GetNumChannel() + 2),
      levinson_durbin_recursion_(num_order),
      linear_predictive_coefficients_to_cepstrum_(num_order, num_order),
      is_valid_(true) {
  if (num_channel <= num_order || liftering_coefficient_ <= 0 ||
      compression_factor_ <= 0.0 || !mel_filter_bank_analysis_.IsValid() ||
      !inverse_fourier_transform_.IsValid() ||
      !levinson_durbin_recursion_.IsValid() ||
      !linear_predictive_coefficients_to_cepstrum_.IsValid()) {
    is_valid_ = false;
    return;
  }

  std::vector<double> center_frequencies;
  if (!mel_filter_bank_analysis_.GetCenterFrequencies(&center_frequencies)) {
    is_valid_ = false;
    return;
  }

  equal_loudness_curve_.resize(num_channel);
  double* e(&(equal_loudness_curve_[0]));
  for (int m(0); m < num_channel; ++m) {
    const double f1(center_frequencies[m] * center_frequencies[m]);
    const double f2(f1 / (f1 + 1.6e5));
    e[m] = f2 * f2 * (f1 + 1.44e6) / (f1 + 9.61e6);
  }

  cepstal_weights_.resize(num_order);
  double* w(&(cepstal_weights_[0]));
  for (int m(0); m < num_order; ++m) {
    const double theta(sptk::kPi * (m + 1) / liftering_coefficient_);
    w[m] = 1.0 + 0.5 * liftering_coefficient_ * std::sin(theta);
  }
}